

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O2

void copy_example_to_adf(cbify *data,example *ec)

{
  uint32_t uVar1;
  vw *pvVar2;
  ulong uVar3;
  example *dst;
  byte *pbVar4;
  unsigned_long *puVar5;
  char cVar6;
  uint64_t *puVar7;
  uint32_t *puVar8;
  byte *pbVar9;
  size_t a;
  ulong uVar10;
  feature_index *idx;
  unsigned_long *puVar11;
  example *__range2;
  bool bVar12;
  char local_39;
  example *local_38;
  
  pvVar2 = data->all;
  bVar12 = (pvVar2->weights).sparse != false;
  puVar8 = &(pvVar2->weights).dense_weights._stride_shift;
  if (bVar12) {
    puVar8 = &(pvVar2->weights).sparse_weights._stride_shift;
  }
  uVar1 = *puVar8;
  puVar7 = &(pvVar2->weights).dense_weights._weight_mask;
  if (bVar12) {
    puVar7 = &(pvVar2->weights).sparse_weights._weight_mask;
  }
  uVar3 = *puVar7;
  local_38 = ec;
  for (uVar10 = 0; uVar10 < (data->adf_data).num_actions; uVar10 = uVar10 + 1) {
    dst = (data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10];
    (*(code *)CB::cb_label)();
    VW::copy_example_data(false,dst,local_38);
    pbVar4 = (dst->super_example_predict).indices._end;
    for (pbVar9 = (dst->super_example_predict).indices._begin; pbVar9 != pbVar4; pbVar9 = pbVar9 + 1
        ) {
      puVar5 = (dst->super_example_predict).feature_space[*pbVar9].indicies._end;
      for (puVar11 = (dst->super_example_predict).feature_space[*pbVar9].indicies._begin;
          puVar11 != puVar5; puVar11 = puVar11 + 1) {
        *puVar11 = (*puVar11 >> ((byte)uVar1 & 0x3f)) * 0x1b90d09 + uVar10 * 0x49be95 <<
                   ((byte)uVar1 & 0x3f) & uVar3;
      }
    }
    bVar12 = CB_ALGS::example_is_newline_not_header(dst);
    if (bVar12) {
      cVar6 = (*(code *)PTR_test_label_002d7078)(&dst->l);
      if (cVar6 != '\0') {
        local_39 = 'n';
        v_array<char>::push_back(&dst->tag,&local_39);
      }
    }
  }
  return;
}

Assistant:

void copy_example_to_adf(cbify& data, example& ec)
{
  auto& adf_data = data.adf_data;
  const uint64_t ss = data.all->weights.stride_shift();
  const uint64_t mask = data.all->weights.mask();

  for (size_t a = 0; a < adf_data.num_actions; ++a)
  {
    auto& eca = *adf_data.ecs[a];
    // clear label
    auto& lab = eca.l.cb;
    CB::cb_label.default_label(&lab);

    // copy data
    VW::copy_example_data(false, &eca, &ec);

    // offset indicies for given action
    for (features& fs : eca)
    {
      for (feature_index& idx : fs.indicies)
      {
        idx = ((((idx >> ss) * 28904713) + 4832917 * (uint64_t)a) << ss) & mask;
      }
    }

    // avoid empty example by adding a tag (hacky)
    if (CB_ALGS::example_is_newline_not_header(eca) && CB::cb_label.test_label(&eca.l))
    {
      eca.tag.push_back('n');
    }
  }
}